

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void __thiscall
c4::yml::Parser::LineContents::reset_with_next_line(LineContents *this,csubstr buf,size_t offset)

{
  char *s_;
  char *pcVar1;
  code *pcVar2;
  csubstr full_;
  bool bVar3;
  ulong uVar4;
  size_t len_;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  char *pcVar8;
  csubstr stripped_;
  basic_substring<const_char> local_78;
  undefined8 local_68;
  csubstr cStack_60;
  ulong local_50;
  LineContents *local_48;
  long local_40;
  size_t local_38;
  
  uVar5 = buf.len;
  if (uVar5 < offset) {
    if ((((byte)s_error_flags & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
      pcVar2 = (code *)swi(3);
      (*pcVar2)();
      return;
    }
    cStack_60 = to_csubstr(
                          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                          );
    local_78.str._0_4_ = 0;
    local_78.str._4_4_ = 0;
    local_78.len._0_4_ = 0x767c;
    local_78.len._4_4_ = 0;
    local_68 = 0;
    (*(code *)PTR_error_impl_0028c7d8)
              ("check failed: offset <= buf.len",0x1f,(anonymous_namespace)::s_default_callbacks);
  }
  local_40 = offset - uVar5;
  if (uVar5 <= offset) {
    if ((((byte)s_error_flags & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
      pcVar2 = (code *)swi(3);
      (*pcVar2)();
      return;
    }
    handle_error(0x230d59,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                 ,0x14c3,"i >= 0 && i < len");
  }
  s_ = buf.str + offset;
  pcVar8 = buf.str + uVar5;
  for (uVar6 = 0; ((pcVar1 = s_ + uVar6, pcVar1 < pcVar8 && (*pcVar1 != '\n')) && (*pcVar1 != '\r'))
      ; uVar6 = uVar6 + 1) {
  }
  local_50 = uVar5;
  local_48 = this;
  if (pcVar1 < s_) {
    if ((((byte)s_error_flags & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
      pcVar2 = (code *)swi(3);
      (*pcVar2)();
      return;
    }
    cStack_60 = to_csubstr(
                          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                          );
    local_78.str._0_4_ = 0;
    local_78.str._4_4_ = 0;
    local_78.len._0_4_ = 0x7682;
    local_78.len._4_4_ = 0;
    local_68 = 0;
    (*(code *)PTR_error_impl_0028c7d8)
              ("check failed: e >= b",0x14,(anonymous_namespace)::s_default_callbacks);
  }
  lVar7 = offset - local_50;
  if (local_50 <= offset && lVar7 != 0) {
    if ((((byte)s_error_flags & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
      pcVar2 = (code *)swi(3);
      (*pcVar2)();
      return;
    }
    handle_error(0x230d59,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                 ,0x153a,"first >= 0 && first <= len");
  }
  if (uVar6 != 0xffffffffffffffff && local_50 < uVar6) {
    if ((((byte)s_error_flags & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
      pcVar2 = (code *)swi(3);
      (*pcVar2)();
      return;
    }
    handle_error(0x230d59,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                 ,0x153b,"(num >= 0 && num <= len) || (num == npos)");
  }
  local_38 = local_50 - offset;
  uVar5 = uVar6;
  if (uVar6 == 0xffffffffffffffff) {
    uVar5 = local_38;
  }
  if (uVar6 != 0 && local_50 < offset + uVar5) {
    if ((((byte)s_error_flags & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
      pcVar2 = (code *)swi(3);
      (*pcVar2)();
      return;
    }
    handle_error(0x230d59,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                 ,0x153d,"(first >= 0 && first + rnum <= len) || (num == 0)");
  }
  basic_substring<const_char>::basic_substring(&local_78,s_,uVar5);
  uVar5 = local_50;
  local_40 = local_40 + uVar6;
  if ((local_40 != 0) && (uVar4 = (ulong)(s_[uVar6] == '\r'), lVar7 + uVar4 + uVar6 != 0)) {
    pcVar8 = pcVar1 + (s_[uVar6 + uVar4] == '\n') + uVar4;
  }
  stripped_.str._4_4_ = local_78.str._4_4_;
  stripped_.str._0_4_ = local_78.str._0_4_;
  stripped_.len._4_4_ = local_78.len._4_4_;
  stripped_.len._0_4_ = (undefined4)local_78.len;
  uVar6 = (long)pcVar8 - (long)s_;
  if (pcVar8 < s_) {
    if ((((byte)s_error_flags & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
      pcVar2 = (code *)swi(3);
      (*pcVar2)();
      return;
    }
    cStack_60 = to_csubstr(
                          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                          );
    local_78.str._0_4_ = 0;
    local_78.str._4_4_ = 0;
    local_78.len._0_4_ = 0x7689;
    local_78.len._4_4_ = 0;
    local_68 = 0;
    (*(code *)PTR_error_impl_0028c7d8)
              ("check failed: e >= b",0x14,(anonymous_namespace)::s_default_callbacks);
  }
  if (uVar5 < offset) {
    if ((((byte)s_error_flags & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
      pcVar2 = (code *)swi(3);
      (*pcVar2)();
      return;
    }
    handle_error(0x230d59,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                 ,0x153a,"first >= 0 && first <= len");
  }
  if (uVar6 != 0xffffffffffffffff && uVar5 < uVar6) {
    if ((((byte)s_error_flags & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
      pcVar2 = (code *)swi(3);
      (*pcVar2)();
      return;
    }
    handle_error(0x230d59,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                 ,0x153b,"(num >= 0 && num <= len) || (num == npos)");
  }
  len_ = local_38;
  if (uVar6 != 0xffffffffffffffff) {
    len_ = uVar6;
  }
  if ((uVar5 < offset + len_) && (pcVar8 != s_)) {
    if ((((byte)s_error_flags & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
      pcVar2 = (code *)swi(3);
      (*pcVar2)();
      return;
    }
    handle_error(0x230d59,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                 ,0x153d,"(first >= 0 && first + rnum <= len) || (num == 0)");
  }
  basic_substring<const_char>::basic_substring(&local_78,s_,len_);
  full_.str._4_4_ = local_78.str._4_4_;
  full_.str._0_4_ = local_78.str._0_4_;
  full_.len._0_4_ = (undefined4)local_78.len;
  full_.len._4_4_ = local_78.len._4_4_;
  reset(local_48,full_,stripped_);
  return;
}

Assistant:

void Parser::LineContents::reset_with_next_line(csubstr buf, size_t offset)
{
    RYML_ASSERT(offset <= buf.len);
    char const* C4_RESTRICT b = &buf[offset];
    char const* C4_RESTRICT e = b;
    // get the current line stripped of newline chars
    while(e < buf.end() && (*e != '\n' && *e != '\r'))
        ++e;
    RYML_ASSERT(e >= b);
    const csubstr stripped_ = buf.sub(offset, static_cast<size_t>(e - b));
    // advance pos to include the first line ending
    if(e != buf.end() && *e == '\r')
        ++e;
    if(e != buf.end() && *e == '\n')
        ++e;
    RYML_ASSERT(e >= b);
    const csubstr full_ = buf.sub(offset, static_cast<size_t>(e - b));
    reset(full_, stripped_);
}